

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O1

bool __thiscall dg::LLVMDependenceGraph::addFormalGlobal(LLVMDependenceGraph *this,Value *val)

{
  LLVMNode *pLVar1;
  Value *pVVar2;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *pNVar3;
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  *this_00;
  LLVMDGParameters *this_01;
  DGParameterPair<dg::LLVMNode> *pDVar4;
  LLVMNode *pLVar5;
  Value *pVVar6;
  pair<dg::LLVMNode_*,_dg::LLVMNode_*> pVar7;
  LLVMNode *local_60;
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  *local_58;
  LLVMNode *local_50;
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  *local_48;
  LLVMNode *local_40;
  DGParameterPair<dg::LLVMNode> *local_38;
  
  this_01 = getOrCreateParameters(this);
  pDVar4 = DGParameters<dg::LLVMNode>::find(this_01,val);
  if (pDVar4 == (DGParameterPair<dg::LLVMNode> *)0x0) {
    pVar7 = DGParameters<dg::LLVMNode>::constructGlobal<llvm::Value*,dg::LLVMDependenceGraph*>
                      (this_01,val,val,this);
    local_40 = pVar7.second;
    pLVar5 = pVar7.first;
    pLVar1 = (this->super_DependenceGraph<dg::LLVMNode>).entryNode;
    local_48 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)&(pLVar1->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   controlDepEdges;
    local_58 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)&(pLVar5->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revControlDepEdges;
    local_60 = pLVar1;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>(local_58,&local_60);
    this_00 = local_48;
    local_60 = pLVar5;
    local_50 = pLVar5;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>(local_48,&local_60);
    pLVar5 = local_40;
    local_60 = pLVar1;
    local_38 = pDVar4;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)&(local_40->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revControlDepEdges,&local_60);
    pDVar4 = local_38;
    local_60 = pLVar5;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>(this_00,&local_60);
    pVVar2 = (pLVar1->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
    pVVar6 = (Value *)0x0;
    if (pVVar2[0x10] == (Value)0x0) {
      pVVar6 = pVVar2;
    }
    if ((pVVar6 != (Value *)0x0) && (pVVar6 == (Value *)this->entryFunction)) {
      local_60 = DependenceGraph<dg::LLVMNode>::_getGlobalNode<llvm::Value*>
                           (&this->super_DependenceGraph<dg::LLVMNode>,val);
      pNVar3 = &local_60->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>;
      std::
      _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
      ::_M_insert_unique<dg::LLVMNode*const&>(local_58,&local_60);
      local_60 = local_50;
      std::
      _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
      ::_M_insert_unique<dg::LLVMNode*const&>
                ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                  *)&pNVar3->controlDepEdges,&local_60);
    }
  }
  return pDVar4 == (DGParameterPair<dg::LLVMNode> *)0x0;
}

Assistant:

bool LLVMDependenceGraph::addFormalGlobal(llvm::Value *val) {
    // add the same formal parameters
    LLVMDGParameters *params = getOrCreateParameters();
    assert(params);

    // if we have this value, just return
    if (params->find(val))
        return false;

    LLVMNode *fpin, *fpout;
    std::tie(fpin, fpout) = params->constructGlobal(val, val, this);
    assert(fpin && fpout);
    assert(fpin->getDG() == this && fpout->getDG() == this);

    LLVMNode *entry = getEntry();
    entry->addControlDependence(fpin);
    entry->addControlDependence(fpout);

    // if these are the formal parameters of the main
    // function, add control dependence also between the
    // global as the formal input parameter representing this global
    if (llvm::Function *F = llvm::dyn_cast<llvm::Function>(entry->getValue())) {
        if (F == entryFunction) {
            auto *gnode = getGlobalNode(val);
            assert(gnode);
            gnode->addControlDependence(fpin);
        }
    }

    return true;
}